

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodeparse.y
# Opt level: O0

int pcodeparseerror(char *s)

{
  PcodeSnippet *pPVar1;
  allocator local_31;
  string local_30 [32];
  char *local_10;
  char *s_local;
  
  pPVar1 = pcode;
  local_10 = s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,s,&local_31);
  (*(pPVar1->super_PcodeCompile)._vptr_PcodeCompile[5])(pPVar1,0,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return 0;
}

Assistant:

int yyerror(const char *s)

{
  pcode->reportError((const Location *)0,s);
  return 0;
}